

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_basic.cpp
# Opt level: O3

void TestDisconnectConnection(void)

{
  iterator iVar1;
  TestB *this;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var2;
  size_t i;
  long lVar3;
  ulong uVar4;
  TestB **ppTVar5;
  vector<TestB_*,_std::allocator<TestB_*>_> *__range1;
  vector<TestB_*,_std::allocator<TestB_*>_> listeners;
  TestB *pb;
  TestA ta;
  TestB **local_b8;
  iterator iStack_b0;
  TestB **local_a8;
  TestB *local_a0;
  slot local_98;
  signal<void_(int)> local_78;
  undefined1 *local_68;
  undefined8 local_60;
  undefined1 local_58;
  undefined7 uStack_57;
  connection local_48;
  
  TestRunner::StartTest("TestDisconnectConnection");
  local_b8 = (TestB **)0x0;
  iStack_b0._M_current = (TestB **)0x0;
  local_a8 = (TestB **)0x0;
  lsignal::slot::slot(&local_98);
  local_98._vptr_slot = (_func_int **)&PTR__TestA_0011a878;
  local_78._data.
  super___shared_ptr<lsignal::signal<void_(int)>::internal_data,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)operator_new(0x58);
  (local_78._data.
   super___shared_ptr<lsignal::signal<void_(int)>::internal_data,_(__gnu_cxx::_Lock_policy)2>.
   _M_refcount._M_pi)->_M_use_count = 1;
  (local_78._data.
   super___shared_ptr<lsignal::signal<void_(int)>::internal_data,_(__gnu_cxx::_Lock_policy)2>.
   _M_refcount._M_pi)->_M_weak_count = 1;
  (local_78._data.
   super___shared_ptr<lsignal::signal<void_(int)>::internal_data,_(__gnu_cxx::_Lock_policy)2>.
   _M_refcount._M_pi)->_vptr__Sp_counted_base = (_func_int **)&PTR___Sp_counted_ptr_inplace_0011ab60
  ;
  local_78._data.
  super___shared_ptr<lsignal::signal<void_(int)>::internal_data,_(__gnu_cxx::_Lock_policy)2>._M_ptr
       = (element_type *)
         (local_78._data.
          super___shared_ptr<lsignal::signal<void_(int)>::internal_data,_(__gnu_cxx::_Lock_policy)2>
          ._M_refcount._M_pi + 1);
  local_78._data.
  super___shared_ptr<lsignal::signal<void_(int)>::internal_data,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi[1]._vptr__Sp_counted_base = (_func_int **)0x0;
  local_78._data.
  super___shared_ptr<lsignal::signal<void_(int)>::internal_data,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi[1]._M_use_count = 0;
  local_78._data.
  super___shared_ptr<lsignal::signal<void_(int)>::internal_data,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi[1]._M_weak_count = 0;
  local_78._data.
  super___shared_ptr<lsignal::signal<void_(int)>::internal_data,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi[2]._vptr__Sp_counted_base = (_func_int **)0x0;
  local_78._data.
  super___shared_ptr<lsignal::signal<void_(int)>::internal_data,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi[2]._M_use_count = 0;
  local_78._data.
  super___shared_ptr<lsignal::signal<void_(int)>::internal_data,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi[2]._M_weak_count = 0;
  local_78._data.
  super___shared_ptr<lsignal::signal<void_(int)>::internal_data,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi[3]._vptr__Sp_counted_base = (_func_int **)0x0;
  local_78._data.
  super___shared_ptr<lsignal::signal<void_(int)>::internal_data,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi[3]._M_use_count = 0;
  local_78._data.
  super___shared_ptr<lsignal::signal<void_(int)>::internal_data,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi[3]._M_weak_count = 0;
  *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)
   &local_78._data.
    super___shared_ptr<lsignal::signal<void_(int)>::internal_data,_(__gnu_cxx::_Lock_policy)2>.
    _M_refcount._M_pi[4]._M_use_count =
       local_78._data.
       super___shared_ptr<lsignal::signal<void_(int)>::internal_data,_(__gnu_cxx::_Lock_policy)2>.
       _M_refcount._M_pi + 4;
  local_78._data.
  super___shared_ptr<lsignal::signal<void_(int)>::internal_data,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi[4]._vptr__Sp_counted_base =
       (_func_int **)
       (local_78._data.
        super___shared_ptr<lsignal::signal<void_(int)>::internal_data,_(__gnu_cxx::_Lock_policy)2>.
        _M_refcount._M_pi + 4);
  local_78._data.
  super___shared_ptr<lsignal::signal<void_(int)>::internal_data,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi[5]._vptr__Sp_counted_base = (_func_int **)0x0;
  local_68 = &local_58;
  local_60 = 0;
  local_58 = 0;
  lVar3 = 1000;
  do {
    this = (TestB *)operator_new(0x50);
    (this->explicitConnectionA)._data.
    super___shared_ptr<lsignal::connection_data,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)0x0;
    (this->explicitConnectionA)._data.
    super___shared_ptr<lsignal::connection_data,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
         (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    *(undefined8 *)&this->dataA = 0;
    (this->explicitConnectionA)._vptr_connection = (_func_int **)0x0;
    (this->sigB)._data.
    super___shared_ptr<lsignal::signal<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>::internal_data,_(__gnu_cxx::_Lock_policy)2>
    ._M_ptr = (element_type *)0x0;
    (this->sigB)._data.
    super___shared_ptr<lsignal::signal<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>::internal_data,_(__gnu_cxx::_Lock_policy)2>
    ._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    (this->super_slot)._cleaners.
    super__Vector_base<lsignal::connection_cleaner,_std::allocator<lsignal::connection_cleaner>_>.
    _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    (this->super_slot)._cleaners.
    super__Vector_base<lsignal::connection_cleaner,_std::allocator<lsignal::connection_cleaner>_>.
    _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    (this->super_slot)._vptr_slot = (_func_int **)0x0;
    (this->super_slot)._cleaners.
    super__Vector_base<lsignal::connection_cleaner,_std::allocator<lsignal::connection_cleaner>_>.
    _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    lsignal::slot::slot((slot *)this);
    (this->super_slot)._vptr_slot = (_func_int **)&PTR__TestB_0011a8b0;
    p_Var2 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)operator_new(0x58);
    p_Var2->_M_use_count = 1;
    p_Var2->_M_weak_count = 1;
    p_Var2->_vptr__Sp_counted_base = (_func_int **)&PTR___Sp_counted_ptr_inplace_0011a8e8;
    p_Var2[1]._vptr__Sp_counted_base = (_func_int **)0x0;
    p_Var2[1]._M_use_count = 0;
    p_Var2[1]._M_weak_count = 0;
    p_Var2[2]._vptr__Sp_counted_base = (_func_int **)0x0;
    p_Var2[2]._M_use_count = 0;
    p_Var2[2]._M_weak_count = 0;
    p_Var2[3]._vptr__Sp_counted_base = (_func_int **)0x0;
    p_Var2[3]._M_use_count = 0;
    p_Var2[3]._M_weak_count = 0;
    *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)&p_Var2[4]._M_use_count = p_Var2 + 4;
    p_Var2[4]._vptr__Sp_counted_base = (_func_int **)(p_Var2 + 4);
    p_Var2[5]._vptr__Sp_counted_base = (_func_int **)0x0;
    (this->sigB)._data.
    super___shared_ptr<lsignal::signal<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>::internal_data,_(__gnu_cxx::_Lock_policy)2>
    ._M_refcount._M_pi = p_Var2;
    (this->sigB)._data.
    super___shared_ptr<lsignal::signal<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>::internal_data,_(__gnu_cxx::_Lock_policy)2>
    ._M_ptr = (element_type *)(p_Var2 + 1);
    lsignal::connection::connection(&this->explicitConnectionA);
    local_a0 = this;
    if (iStack_b0._M_current == local_a8) {
      std::vector<TestB*,std::allocator<TestB*>>::_M_realloc_insert<TestB*const&>
                ((vector<TestB*,std::allocator<TestB*>> *)&local_b8,iStack_b0,&local_a0);
    }
    else {
      *iStack_b0._M_current = this;
      iStack_b0._M_current = iStack_b0._M_current + 1;
    }
    lsignal::signal<void(int)>::connect<TestB,TestB>
              (&local_48,&local_78,local_a0,0x10f628,(slot *)0x0);
    (local_a0->explicitConnectionA)._data.
    super___shared_ptr<lsignal::connection_data,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         local_48._data.super___shared_ptr<lsignal::connection_data,_(__gnu_cxx::_Lock_policy)2>.
         _M_ptr;
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::operator=
              (&(local_a0->explicitConnectionA)._data.
                super___shared_ptr<lsignal::connection_data,_(__gnu_cxx::_Lock_policy)2>._M_refcount
               ,&local_48._data.
                 super___shared_ptr<lsignal::connection_data,_(__gnu_cxx::_Lock_policy)2>.
                 _M_refcount);
    lsignal::connection::~connection(&local_48);
    lVar3 = lVar3 + -1;
  } while (lVar3 != 0);
  receiveSigACount = 0;
  lsignal::signal<void_(int)>::operator()(&local_78,0x17);
  AssertHelper::VerifyValue(true,receiveSigACount == 1000,"Verify siga count1");
  uVar4 = 0xfffffffffffffffe;
  do {
    lsignal::connection::disconnect(&local_b8[uVar4 + 2]->explicitConnectionA);
    uVar4 = uVar4 + 2;
  } while (uVar4 < 0x3e6);
  receiveSigACount = 0;
  lsignal::signal<void_(int)>::operator()(&local_78,0x22);
  AssertHelper::VerifyValue(true,receiveSigACount == 500,"Verify siga count/2");
  receiveSigACount = 0;
  lVar3 = 0;
  do {
    lsignal::connection::disconnect(&local_b8[lVar3]->explicitConnectionA);
    lVar3 = lVar3 + 1;
  } while (lVar3 != 1000);
  lsignal::signal<void_(int)>::operator()(&local_78,0x2d);
  AssertHelper::VerifyValue(true,receiveSigACount == 0,"Verify disconnect_all");
  iVar1._M_current = iStack_b0._M_current;
  for (ppTVar5 = local_b8; ppTVar5 != iVar1._M_current; ppTVar5 = ppTVar5 + 1) {
    if (*ppTVar5 != (TestB *)0x0) {
      (*((*ppTVar5)->super_slot)._vptr_slot[1])();
    }
  }
  local_98._vptr_slot = (_func_int **)&PTR__TestA_0011a878;
  if (local_68 != &local_58) {
    operator_delete(local_68,CONCAT71(uStack_57,local_58) + 1);
  }
  if (local_78._data.
      super___shared_ptr<lsignal::signal<void_(int)>::internal_data,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_78._data.
               super___shared_ptr<lsignal::signal<void_(int)>::internal_data,_(__gnu_cxx::_Lock_policy)2>
               ._M_refcount._M_pi);
  }
  lsignal::slot::~slot(&local_98);
  if (local_b8 != (TestB **)0x0) {
    operator_delete(local_b8,(long)local_a8 - (long)local_b8);
  }
  return;
}

Assistant:

void TestDisconnectConnection()
{
	TestRunner::StartTest(MethodName);
	std::vector<TestB*> listeners;
	TestA ta;
	const size_t count = 1000;
	for (size_t i = 0; i < count; i++)
	{
		TestB* pb = new TestB();
		listeners.push_back(pb);
		pb->explicitConnectionA = ta.sigA.connect(pb, &TestB::ReceiveSigA, pb);
	}

	receiveSigACount = 0;
	ta.sigA(23);
	AssertHelper::VerifyValue(true, receiveSigACount == count, "Verify siga count1");

	for (size_t i = 0; i < count; i += 2)
	{
		ta.sigA.disconnect(listeners[i]->explicitConnectionA);
	}

	receiveSigACount = 0;
	ta.sigA(34);
	AssertHelper::VerifyValue(true, receiveSigACount == count / 2, "Verify siga count/2");

	receiveSigACount = 0;
	for (size_t i = 0; i < count; i++)
	{
		ta.sigA.disconnect(listeners[i]->explicitConnectionA);
	}

	ta.sigA(45);
	AssertHelper::VerifyValue(true, receiveSigACount == 0, "Verify disconnect_all");

	for (TestB* pb : listeners)
		delete pb;
}